

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall cmTarget::SetProperty(cmTarget *this,string *prop,char *value)

{
  TargetType tgtType;
  cmMakefile *pcVar1;
  cmTargetInternals *pcVar2;
  bool bVar3;
  cmMessenger *messenger;
  ostream *poVar4;
  char *pcVar5;
  allocator local_1c9;
  string local_1c8;
  ostringstream e;
  
  tgtType = this->TargetTypeValue;
  messenger = cmMakefile::GetMessenger(this->Makefile);
  cmMakefile::GetBacktrace((cmListFileBacktrace *)&e,this->Makefile);
  bVar3 = cmTargetPropertyComputer::PassesWhitelist
                    (tgtType,prop,messenger,(cmListFileBacktrace *)&e);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&e);
  if (!bVar3) {
    return;
  }
  bVar3 = std::operator==(prop,"MANUALLY_ADDED_DEPENDENCIES");
  if (bVar3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    std::operator<<((ostream *)&e,"MANUALLY_ADDED_DEPENDENCIES property is read-only\n");
    pcVar1 = this->Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c8);
  }
  else {
    bVar3 = std::operator==(prop,"NAME");
    if (bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      std::operator<<((ostream *)&e,"NAME property is read-only\n");
      pcVar1 = this->Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c8);
    }
    else {
      bVar3 = std::operator==(prop,"TYPE");
      if (bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        std::operator<<((ostream *)&e,"TYPE property is read-only\n");
        pcVar1 = this->Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c8);
      }
      else {
        bVar3 = std::operator==(prop,"EXPORT_NAME");
        if ((bVar3) && (this->IsImportedTarget == true)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          poVar4 = std::operator<<((ostream *)&e,
                                   "EXPORT_NAME property can\'t be set on imported targets (\"");
          poVar4 = std::operator<<(poVar4,(string *)&this->Name);
          std::operator<<(poVar4,"\")\n");
          pcVar1 = this->Makefile;
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c8);
        }
        else {
          bVar3 = std::operator==(prop,"SOURCES");
          if ((!bVar3) || (this->IsImportedTarget != true)) {
            bVar3 = std::operator==(prop,"INCLUDE_DIRECTORIES");
            if (bVar3) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::clear(&((this->Internal).Pointer)->IncludeDirectoriesEntries);
              std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                        (&((this->Internal).Pointer)->IncludeDirectoriesBacktraces);
              if (value == (char *)0x0) {
                return;
              }
              pcVar2 = (this->Internal).Pointer;
              std::__cxx11::string::string((string *)&e,value,(allocator *)&local_1c8);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pcVar2
                         ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e);
              std::__cxx11::string::~string((string *)&e);
              cmMakefile::GetBacktrace((cmListFileBacktrace *)&e,this->Makefile);
              std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                        (&((this->Internal).Pointer)->IncludeDirectoriesBacktraces,
                         (cmListFileBacktrace *)&e);
            }
            else {
              bVar3 = std::operator==(prop,"COMPILE_OPTIONS");
              if (bVar3) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::clear(&((this->Internal).Pointer)->CompileOptionsEntries);
                std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                          (&((this->Internal).Pointer)->CompileOptionsBacktraces);
                if (value == (char *)0x0) {
                  return;
                }
                pcVar2 = (this->Internal).Pointer;
                std::__cxx11::string::string((string *)&e,value,(allocator *)&local_1c8);
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &pcVar2->CompileOptionsEntries,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e);
                std::__cxx11::string::~string((string *)&e);
                cmMakefile::GetBacktrace((cmListFileBacktrace *)&e,this->Makefile);
                std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                          (&((this->Internal).Pointer)->CompileOptionsBacktraces,
                           (cmListFileBacktrace *)&e);
              }
              else {
                bVar3 = std::operator==(prop,"COMPILE_FEATURES");
                if (bVar3) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::clear(&((this->Internal).Pointer)->CompileFeaturesEntries);
                  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                            (&((this->Internal).Pointer)->CompileFeaturesBacktraces);
                  if (value == (char *)0x0) {
                    return;
                  }
                  pcVar2 = (this->Internal).Pointer;
                  std::__cxx11::string::string((string *)&e,value,(allocator *)&local_1c8);
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &pcVar2->CompileFeaturesEntries,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e
                            );
                  std::__cxx11::string::~string((string *)&e);
                  cmMakefile::GetBacktrace((cmListFileBacktrace *)&e,this->Makefile);
                  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                            (&((this->Internal).Pointer)->CompileFeaturesBacktraces,
                             (cmListFileBacktrace *)&e);
                }
                else {
                  bVar3 = std::operator==(prop,"COMPILE_DEFINITIONS");
                  if (bVar3) {
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::clear(&((this->Internal).Pointer)->CompileDefinitionsEntries);
                    std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                              (&((this->Internal).Pointer)->CompileDefinitionsBacktraces);
                    if (value == (char *)0x0) {
                      return;
                    }
                    pcVar2 = (this->Internal).Pointer;
                    std::__cxx11::string::string((string *)&e,value,(allocator *)&local_1c8);
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &pcVar2->CompileDefinitionsEntries,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &e);
                    std::__cxx11::string::~string((string *)&e);
                    cmMakefile::GetBacktrace((cmListFileBacktrace *)&e,this->Makefile);
                    std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                    push_back(&((this->Internal).Pointer)->CompileDefinitionsBacktraces,
                              (cmListFileBacktrace *)&e);
                  }
                  else {
                    bVar3 = std::operator==(prop,"LINK_LIBRARIES");
                    if (bVar3) {
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::clear(&((this->Internal).Pointer)->LinkImplementationPropertyEntries);
                      std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                                (&((this->Internal).Pointer)->LinkImplementationPropertyBacktraces);
                      if (value == (char *)0x0) {
                        return;
                      }
                      cmMakefile::GetBacktrace((cmListFileBacktrace *)&e,this->Makefile);
                      pcVar2 = (this->Internal).Pointer;
                      std::__cxx11::string::string((string *)&local_1c8,value,&local_1c9);
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&pcVar2->LinkImplementationPropertyEntries,&local_1c8);
                      std::__cxx11::string::~string((string *)&local_1c8);
                      std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                      push_back(&((this->Internal).Pointer)->LinkImplementationPropertyBacktraces,
                                (value_type *)&e);
                    }
                    else {
                      bVar3 = std::operator==(prop,"SOURCES");
                      if (!bVar3) {
                        bVar3 = cmHasLiteralPrefix<std::__cxx11::string,17ul>
                                          (prop,(char (*) [17])"IMPORTED_LIBNAME");
                        if (bVar3) {
                          pcVar5 = "";
                          if (value != (char *)0x0) {
                            pcVar5 = value;
                          }
                          std::__cxx11::string::string((string *)&e,pcVar5,(allocator *)&local_1c8);
                          bVar3 = CheckImportedLibName(this,prop,(string *)&e);
                          std::__cxx11::string::~string((string *)&e);
                          if (!bVar3) {
                            return;
                          }
                        }
                        bVar3 = std::operator==(prop,"CUDA_PTX_COMPILATION");
                        if ((!bVar3) || (this->TargetTypeValue == OBJECT_LIBRARY)) {
                          cmPropertyMap::SetProperty(&this->Properties,prop,value);
                          return;
                        }
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
                        poVar4 = std::operator<<((ostream *)&e,
                                                 "CUDA_PTX_COMPILATION property can only be applied to OBJECT targets (\""
                                                );
                        poVar4 = std::operator<<(poVar4,(string *)&this->Name);
                        std::operator<<(poVar4,"\")\n");
                        pcVar1 = this->Makefile;
                        std::__cxx11::stringbuf::str();
                        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c8);
                        goto LAB_00316bba;
                      }
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::clear(&((this->Internal).Pointer)->SourceEntries);
                      std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                                (&((this->Internal).Pointer)->SourceBacktraces);
                      if (value == (char *)0x0) {
                        return;
                      }
                      cmMakefile::GetBacktrace((cmListFileBacktrace *)&e,this->Makefile);
                      pcVar2 = (this->Internal).Pointer;
                      std::__cxx11::string::string((string *)&local_1c8,value,&local_1c9);
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&pcVar2->SourceEntries,&local_1c8);
                      std::__cxx11::string::~string((string *)&local_1c8);
                      std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                      push_back(&((this->Internal).Pointer)->SourceBacktraces,(value_type *)&e);
                    }
                  }
                }
              }
            }
            cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&e);
            return;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          poVar4 = std::operator<<((ostream *)&e,
                                   "SOURCES property can\'t be set on imported targets (\"");
          poVar4 = std::operator<<(poVar4,(string *)&this->Name);
          std::operator<<(poVar4,"\")\n");
          pcVar1 = this->Makefile;
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c8);
        }
      }
    }
  }
LAB_00316bba:
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  return;
}

Assistant:

void cmTarget::SetProperty(const std::string& prop, const char* value)
{
  if (!cmTargetPropertyComputer::PassesWhitelist(
        this->GetType(), prop, this->Makefile->GetMessenger(),
        this->Makefile->GetBacktrace())) {
    return;
  }
  if (prop == "MANUALLY_ADDED_DEPENDENCIES") {
    std::ostringstream e;
    e << "MANUALLY_ADDED_DEPENDENCIES property is read-only\n";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
  }
  if (prop == "NAME") {
    std::ostringstream e;
    e << "NAME property is read-only\n";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
  }
  if (prop == "TYPE") {
    std::ostringstream e;
    e << "TYPE property is read-only\n";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
  }
  if (prop == "EXPORT_NAME" && this->IsImported()) {
    std::ostringstream e;
    e << "EXPORT_NAME property can't be set on imported targets (\""
      << this->Name << "\")\n";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
  }
  if (prop == "SOURCES" && this->IsImported()) {
    std::ostringstream e;
    e << "SOURCES property can't be set on imported targets (\"" << this->Name
      << "\")\n";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
  }

  if (prop == "INCLUDE_DIRECTORIES") {
    this->Internal->IncludeDirectoriesEntries.clear();
    this->Internal->IncludeDirectoriesBacktraces.clear();
    if (value) {
      this->Internal->IncludeDirectoriesEntries.push_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->IncludeDirectoriesBacktraces.push_back(lfbt);
    }
  } else if (prop == "COMPILE_OPTIONS") {
    this->Internal->CompileOptionsEntries.clear();
    this->Internal->CompileOptionsBacktraces.clear();
    if (value) {
      this->Internal->CompileOptionsEntries.push_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->CompileOptionsBacktraces.push_back(lfbt);
    }
  } else if (prop == "COMPILE_FEATURES") {
    this->Internal->CompileFeaturesEntries.clear();
    this->Internal->CompileFeaturesBacktraces.clear();
    if (value) {
      this->Internal->CompileFeaturesEntries.push_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->CompileFeaturesBacktraces.push_back(lfbt);
    }
  } else if (prop == "COMPILE_DEFINITIONS") {
    this->Internal->CompileDefinitionsEntries.clear();
    this->Internal->CompileDefinitionsBacktraces.clear();
    if (value) {
      this->Internal->CompileDefinitionsEntries.push_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->CompileDefinitionsBacktraces.push_back(lfbt);
    }
  } else if (prop == "LINK_LIBRARIES") {
    this->Internal->LinkImplementationPropertyEntries.clear();
    this->Internal->LinkImplementationPropertyBacktraces.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->LinkImplementationPropertyEntries.push_back(value);
      this->Internal->LinkImplementationPropertyBacktraces.push_back(lfbt);
    }
  } else if (prop == "SOURCES") {
    this->Internal->SourceEntries.clear();
    this->Internal->SourceBacktraces.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->SourceEntries.push_back(value);
      this->Internal->SourceBacktraces.push_back(lfbt);
    }
  } else if (cmHasLiteralPrefix(prop, "IMPORTED_LIBNAME") &&
             !this->CheckImportedLibName(prop, value ? value : "")) {
    /* error was reported by check method */
  } else if (prop == "CUDA_PTX_COMPILATION" &&
             this->GetType() != cmStateEnums::OBJECT_LIBRARY) {
    std::ostringstream e;
    e << "CUDA_PTX_COMPILATION property can only be applied to OBJECT "
         "targets (\""
      << this->Name << "\")\n";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
  } else {
    this->Properties.SetProperty(prop, value);
  }
}